

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::Builder(Builder *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xe8);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011cbd8;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&p_Var1[2]._M_use_count;
  p_Var1[1]._M_use_count = 0xc0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&p_Var1[2]._M_use_count = 0;
  (this->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->_buffer).
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var1 + 1);
  this->_bufferPtr = (element_type *)(p_Var1 + 1);
  this->_start = (uint8_t *)&p_Var1[2]._M_use_count;
  this->_pos = 0;
  (this->_arena).ptr_ = (this->_arena).buf_;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Tp_alloc_type.a_ = &this->_arena;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_keyWritten = false;
  this->options = &Options::Defaults;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::reserve(&this->_stack,4);
  return;
}

Assistant:

Builder::Builder()
    : _buffer(std::make_shared<Buffer<uint8_t>>()),
      _bufferPtr(_buffer.get()),
      _start(_bufferPtr->data()),
      _pos(0),
      _arena(),
      _stack(_arena),
      _keyWritten(false),
      options(&Options::Defaults) {
  // do a full initial allocation in the arena, so we can maximize its usage
  _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
}